

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

void jessilib::impl_join::
     join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>&,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
               (string *out_string,basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_string
               ,basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_args,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_args_1)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_args_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_48;
  
  in_string_00._M_str = (char8_t *)in_args_1;
  in_string_00._M_len = (size_t)in_string->_M_str;
  in_args_00 = in_args_1;
  ustring_to_mbstring<char8_t>(&pStack_48,(jessilib *)in_string->_M_len,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (out_string,pStack_48.second._M_dataplus._M_p,pStack_48.second._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_48.second._M_dataplus._M_p != &pStack_48.second.field_2) {
    operator_delete(pStack_48.second._M_dataplus._M_p,
                    pStack_48.second.field_2._M_allocated_capacity + 1);
  }
  join_mb_append<std::basic_string_view<char32_t,std::char_traits<char32_t>>&,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            ((impl_join *)out_string,(string *)in_args,
             (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)in_args_1,in_args_00);
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}